

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int stbi_png_test_file(FILE *f)

{
  int iVar1;
  long lVar2;
  png p;
  
  lVar2 = ftell((FILE *)f);
  p.s.img_file = f;
  iVar1 = parse_png_file(&p,1,0);
  fseek((FILE *)f,(long)(int)lVar2,0);
  return iVar1;
}

Assistant:

int stbi_png_test_file(FILE *f)
{
   png p;
   int n,r;
   n = ftell(f);
   start_file(&p.s, f);
   r = parse_png_file(&p, SCAN_type,STBI_default);
   fseek(f,n,SEEK_SET);
   return r;
}